

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpmultipart_p.h
# Opt level: O1

void __thiscall QHttpPartPrivate::~QHttpPartPrivate(QHttpPartPrivate *this)

{
  Data *pDVar1;
  Data *pDVar2;
  
  pDVar1 = (this->header).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->header).d.d)->super_QArrayData,1,0x10);
    }
  }
  pDVar1 = (this->body).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->body).d.d)->super_QArrayData,1,0x10);
    }
  }
  pDVar2 = (this->super_QNetworkHeadersPrivate).originatingObject.wp.d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->weakref)._q_value.super___atomic_base<int>._M_i =
         (pDVar2->weakref)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pDVar2->weakref)._q_value.super___atomic_base<int>._M_i == 0) &&
       (pDVar2 = (this->super_QNetworkHeadersPrivate).originatingObject.wp.d, pDVar2 != (Data *)0x0)
       ) {
      operator_delete(pDVar2);
    }
  }
  QHash<QNetworkRequest::Attribute,_QVariant>::~QHash
            (&(this->super_QNetworkHeadersPrivate).attributes);
  QHash<QNetworkRequest::KnownHeaders,_QVariant>::~QHash
            (&(this->super_QNetworkHeadersPrivate).cookedHeaders);
  QHttpHeaders::~QHttpHeaders(&(this->super_QNetworkHeadersPrivate).httpHeaders);
  QArrayDataPointer<std::pair<QByteArray,_QByteArray>_>::~QArrayDataPointer
            ((QArrayDataPointer<std::pair<QByteArray,_QByteArray>_> *)
             &this->super_QNetworkHeadersPrivate);
  return;
}

Assistant:

~QHttpPartPrivate()
    {
    }